

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcBoxedHalfSpace::~IfcBoxedHalfSpace(IfcBoxedHalfSpace *this)

{
  ~IfcBoxedHalfSpace((IfcBoxedHalfSpace *)
                     &this[-1].super_IfcHalfSpaceSolid.super_IfcGeometricRepresentationItem.
                      field_0x30);
  return;
}

Assistant:

IfcBoxedHalfSpace() : Object("IfcBoxedHalfSpace") {}